

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor,
               ImU32 col_fill,ImU32 col_border,ImU32 col_shadow)

{
  ImFontAtlas *this;
  ImTextureID texture_id;
  undefined1 auVar1 [16];
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 size;
  ImVec2 offset;
  ImVec2 uv [4];
  ImVec2 local_e0;
  ImU32 local_d8;
  ImU32 local_d4;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 IStack_90;
  ImVec2 local_88;
  ImVec2 IStack_80;
  float local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (mouse_cursor != -1) {
    local_d0 = pos;
    local_78 = scale;
    if (7 < (uint)mouse_cursor) {
      __assert_fail("mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_draw.cpp"
                    ,0xbe5,
                    "void ImGui::RenderMouseCursor(ImDrawList *, ImVec2, float, ImGuiMouseCursor, ImU32, ImU32, ImU32)"
                   );
    }
    this = draw_list->_Data->Font->ContainerAtlas;
    local_c0.x = 0.0;
    local_c0.y = 0.0;
    local_c8.x = 0.0;
    local_c8.y = 0.0;
    local_88.x = 0.0;
    local_88.y = 0.0;
    IStack_80.x = 0.0;
    IStack_80.y = 0.0;
    local_98.x = 0.0;
    local_98.y = 0.0;
    IStack_90.x = 0.0;
    IStack_90.y = 0.0;
    bVar2 = ImFontAtlas::GetMouseCursorTexData
                      (this,mouse_cursor,&local_c0,&local_c8,&local_98,&local_88);
    if (bVar2) {
      fVar4 = local_d0.x - local_c0.x;
      fVar3 = local_d0.y - local_c0.y;
      local_d0.y = fVar3;
      local_d0.x = fVar4;
      texture_id = this->TexID;
      ImDrawList::PushTextureID(draw_list,texture_id);
      fVar5 = local_78 * 0.0 + fVar3;
      local_68 = ZEXT416((uint)fVar5);
      local_e0.y = fVar5;
      local_e0.x = fVar4 + local_78;
      _local_b8 = ZEXT416((uint)(local_c8.x * local_78));
      local_48 = ZEXT416((uint)(local_c8.y * local_78));
      fVar5 = fVar5 + local_c8.y * local_78;
      local_58 = ZEXT416((uint)fVar5);
      local_a0.y = fVar5;
      local_a0.x = fVar4 + local_78 + local_c8.x * local_78;
      local_d8 = col_border;
      local_d4 = col_fill;
      ImDrawList::AddImage(draw_list,texture_id,&local_e0,&local_a0,&local_88,&IStack_80,col_shadow)
      ;
      fVar5 = local_78 + local_78 + fVar4;
      local_e0.y = (float)local_68._0_4_;
      local_e0.x = fVar5;
      local_a0.y = (float)local_58._0_4_;
      local_a0.x = fVar5 + (float)local_b8._0_4_;
      ImDrawList::AddImage(draw_list,texture_id,&local_e0,&local_a0,&local_88,&IStack_80,col_shadow)
      ;
      uStack_b0 = local_b8._4_4_;
      local_b8._0_4_ = (float)local_b8._0_4_ + fVar4;
      local_b8._4_4_ = (float)local_48._0_4_ + fVar3;
      uStack_ac = local_48._4_4_;
      local_e0.y = (float)local_48._0_4_ + fVar3;
      local_e0.x = (float)local_b8._0_4_;
      ImDrawList::AddImage(draw_list,texture_id,&local_d0,&local_e0,&local_88,&IStack_80,local_d8);
      auVar1 = _local_b8;
      local_e0.x = (float)local_b8._0_4_;
      local_e0.y = (float)local_b8._4_4_;
      _local_b8 = auVar1;
      ImDrawList::AddImage(draw_list,texture_id,&local_d0,&local_e0,&local_98,&IStack_90,local_d4);
      ImDrawList::PopTextureID(draw_list);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        const ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1,0)*scale, pos + ImVec2(1,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2,0)*scale, pos + ImVec2(2,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}